

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O2

int __thiscall
gmlc::utilities::stringOps::trailingStringInt(stringOps *this,string_view input,int defNum)

{
  ulong uVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  int num;
  string_view input_local;
  
  num = (int)input._M_str;
  input_local._M_str = (char *)input._M_len;
  if ((this != (stringOps *)0x0) &&
     (0xfffffff5 < (int)(input_local._M_str + -1)[(long)this] - 0x3aU)) {
    input_local._M_len = (size_t)this;
    uVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                      (&input_local,"0123456789",0xffffffffffffffff,10);
    num = 0;
    if (uVar1 == 0xffffffffffffffff) {
      if (input_local._M_len < 0xb) {
        CLI::std::from_chars<int>
                  (input_local._M_str,input_local._M_str + input_local._M_len,&num,10);
        return num;
      }
      uVar1 = input_local._M_len - 10;
    }
    else if (uVar1 == input_local._M_len - 2) {
      return input_local._M_str[input_local._M_len - 1] + -0x30;
    }
    if (input_local._M_len < 0xb || input_local._M_len - 10 <= uVar1) {
      bVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)&input_local,uVar1 + 1,
                         0xffffffffffffffff);
      CLI::std::from_chars<int>(bVar2._M_str,bVar2._M_str + bVar2._M_len,&num,10);
    }
    else {
      bVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)&input_local,
                         input_local._M_len - 9,0xffffffffffffffff);
      CLI::std::from_chars<int>(bVar2._M_str,bVar2._M_str + bVar2._M_len,&num,10);
    }
  }
  return num;
}

Assistant:

int trailingStringInt(std::string_view input, int defNum) noexcept
    {
        if ((input.empty()) || (isdigit(input.back()) == 0)) {
            return defNum;
        }

        auto pos1 = input.find_last_not_of(digits);
        int num{0};
        if (pos1 == std::string::npos)  // in case the whole thing is a number
        {
            if (input.length() <= 10) {
                std::from_chars(input.data(), input.data() + input.size(), num);
                return num;
            }
            pos1 = input.length() - 10;
        }

        size_t length = input.length();
        if (pos1 == length - 2) {
            return input.back() - '0';
        }
        if ((length <= 10) || (pos1 >= length - 10)) {
            auto sub = input.substr(pos1 + 1);

            std::from_chars(sub.data(), sub.data() + sub.size(), num);
            return num;
        }
        auto sub = input.substr(length - 9);

        std::from_chars(sub.data(), sub.data() + sub.size(), num);
        return num;
    }